

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_float.h
# Opt level: O2

istream * spvtools::utils::operator>>
                    (istream *is,
                    HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
                    *value)

{
  ulong uVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  istream *piVar8;
  uint uVar9;
  int iVar10;
  short sVar11;
  ushort uVar12;
  uint uVar13;
  byte bVar14;
  uint uVar15;
  short sVar16;
  ushort uVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  uint local_4c;
  
  (value->value_).data_ = 0;
  if (((byte)is[*(long *)(*(long *)is + -0x18) + 0x19] & 0x10) != 0) {
    while( true ) {
      iVar3 = std::istream::peek();
      iVar3 = isspace(iVar3);
      if (iVar3 == 0) break;
      std::istream::get();
    }
  }
  iVar3 = std::istream::peek();
  if ((iVar3 == 0x2d) || (iVar3 == 0x30)) {
    iVar4 = iVar3;
    if (iVar3 == 0x2d) {
      std::istream::get();
      iVar4 = std::istream::peek();
    }
    if (iVar4 == 0x30) {
      std::istream::get();
      uVar5 = std::istream::peek();
      if ((uVar5 & 0xffffffdf) == 0x58) {
        do {
          std::istream::get();
          uVar5 = std::istream::peek();
        } while (uVar5 == 0x30);
        iVar4 = 0xf;
        uVar17 = 0;
        bVar14 = 0;
        bVar2 = 0;
        local_4c = 0;
        bVar18 = false;
        bVar20 = false;
        while ((!bVar18 && (!bVar20))) {
          if (uVar5 == 0x2e) {
            bVar18 = true;
          }
          else if (uVar5 == 0x70) {
            bVar20 = true;
            bVar18 = false;
          }
          else {
            iVar6 = isxdigit(uVar5);
            if (iVar6 == 0) goto LAB_001eb9e7;
            bVar2 = get_nibble_from_character(uVar5);
            uVar7 = (ulong)bVar2;
            iVar6 = 4;
            while (bVar18 = iVar6 != 0, iVar6 = iVar6 + -1, bVar18) {
              uVar1 = (uVar7 & 0xffff) >> 3;
              if ((bVar14 & 1) != 0) {
                if ((short)iVar4 == 0x7fff) goto LAB_001eb9e7;
                uVar5 = (uint)uVar1 & 1;
                uVar12 = uVar17 + 1;
                if (uVar12 == 0) {
                  uVar12 = 0xffff;
                }
                uVar15 = uVar5 << (0xfU - (char)uVar17 & 0x1f);
                if ((short)uVar5 == 0) {
                  uVar15 = 0;
                }
                if (0xf < uVar17) {
                  uVar15 = 0;
                }
                local_4c = local_4c | uVar15;
                iVar4 = iVar4 + 1;
                uVar17 = uVar12;
              }
              bVar14 = bVar14 | (byte)uVar1;
              uVar7 = (ulong)(uint)((int)uVar7 * 2);
            }
            bVar18 = false;
            bVar2 = 1;
          }
          std::istream::get();
          uVar5 = std::istream::peek();
        }
        uVar15 = 0;
        while (!(bool)(bVar18 ^ 1U | bVar20)) {
          if (uVar5 == 0x70) {
            bVar20 = true;
          }
          else {
            iVar6 = isxdigit(uVar5);
            if (iVar6 == 0) goto LAB_001eb9e7;
            bVar14 = get_nibble_from_character(uVar5);
            uVar5 = (uint)bVar14;
            iVar6 = 4;
            while (bVar19 = iVar6 != 0, iVar6 = iVar6 + -1, bVar19) {
              uVar9 = uVar5 >> 3 & 1;
              uVar15 = uVar15 | uVar9;
              if ((bVar2 == 0) && ((short)uVar15 == 0)) {
                iVar4 = iVar4 + -1;
              }
              else {
                uVar13 = uVar9 << (0xfU - (char)uVar17 & 0x1f);
                if ((short)uVar9 == 0) {
                  uVar13 = 0;
                }
                if (0xf < uVar17) {
                  uVar13 = 0;
                }
                local_4c = local_4c | uVar13;
                uVar17 = uVar17 + 1;
                if (uVar17 == 0) {
                  uVar17 = 0xffff;
                }
              }
              uVar5 = uVar5 * 2;
            }
          }
          std::istream::get();
          uVar5 = std::istream::peek();
        }
        bVar14 = 1;
        iVar6 = 0;
        bVar20 = false;
        bVar18 = false;
        do {
          sVar11 = (short)iVar6;
          if (bVar18) {
            if (9 < uVar5 - 0x30) {
              sVar11 = sVar11 * (char)bVar14;
              iVar6 = (int)sVar11;
              sVar16 = (short)iVar4;
              if ((sVar11 < 0) || (sVar16 < 0)) {
                if ((sVar11 < 0) && (sVar16 < 0)) {
                  iVar10 = sVar16 + 0x7ffe;
                  uVar5 = 0x8002;
                  if (iVar10 != -iVar6 && SBORROW4(iVar10,-iVar6) == iVar10 + iVar6 < 0) {
                    uVar5 = iVar4 + iVar6;
                  }
                }
                else {
                  uVar5 = iVar6 + iVar4;
                }
              }
              else {
                uVar5 = iVar4 + iVar6;
                if (0x7ffe - sVar16 <= iVar6) {
                  uVar5 = 0x7ffe;
                }
              }
              bVar18 = (short)local_4c == 0;
              bVar20 = (bool)(~bVar2 & bVar18);
              local_4c = local_4c << ~(bVar2 | bVar18);
              uVar15 = local_4c >> 1 | 0xffff8000;
              uVar9 = uVar5;
              if (bVar20) {
                uVar15 = local_4c;
                uVar9 = 0;
              }
              if (bVar2 == 0 && !bVar18) {
                uVar9 = uVar5 - 1;
              }
              uVar17 = (ushort)uVar15;
              if (0 < (short)uVar9) {
                uVar17 = (ushort)local_4c;
              }
              uVar5 = (uint)(uVar17 >> 6);
              while( true ) {
                uVar17 = (ushort)uVar5;
                sVar11 = (short)uVar9;
                if ((-1 < sVar11) || (bVar20)) break;
                uVar5 = uVar5 >> 1;
                bVar20 = uVar17 < 2;
                uVar9 = uVar9 + 1;
                if (bVar20) {
                  uVar9 = 0;
                }
              }
              uVar5 = 0x1f;
              if (sVar11 < 0x1f) {
                uVar5 = uVar9;
              }
              if (0x1f < sVar11) {
                uVar17 = 0;
              }
              (value->value_).data_ =
                   (ushort)((uVar5 & 0x1f) << 10) | (ushort)(iVar3 == 0x2d) << 0xf | uVar17;
              return is;
            }
LAB_001eb9a4:
            iVar6 = iVar6 * 10 + (uVar5 & 0xf);
            if ((short)((0x7ffe - (uVar5 & 0xf) & 0xffff) / 10) <= sVar11) {
              iVar6 = 0x7ffe;
            }
            bVar18 = true;
          }
          else {
            if ((uVar5 != 0x2d) && (uVar5 != 0x2b)) {
              if (uVar5 - 0x30 < 10) goto LAB_001eb9a4;
LAB_001eb9e7:
              std::ios::setstate((int)*(undefined8 *)(*(long *)is + -0x18) + (int)is);
              return is;
            }
            if (bVar20) goto LAB_001eb9e7;
            bVar14 = -(uVar5 == 0x2d) | 1;
            bVar20 = true;
            bVar18 = false;
          }
          std::istream::get();
          uVar5 = std::istream::peek();
        } while( true );
      }
      bVar20 = iVar3 == 0x2d;
      std::istream::unget();
    }
    else {
      bVar20 = iVar3 == 0x2d;
    }
  }
  else {
    bVar20 = false;
  }
  piVar8 = ParseNormalFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>>>
                     (is,bVar20,value);
  return piVar8;
}

Assistant:

std::istream& operator>>(std::istream& is, HexFloat<T, Traits>& value) {
  using HF = HexFloat<T, Traits>;
  using uint_type = typename HF::uint_type;
  using int_type = typename HF::int_type;

  value.set_value(static_cast<typename HF::native_type>(0.f));

  if (is.flags() & std::ios::skipws) {
    // If the user wants to skip whitespace , then we should obey that.
    while (std::isspace(is.peek())) {
      is.get();
    }
  }

  auto next_char = is.peek();
  bool negate_value = false;

  if (next_char != '-' && next_char != '0') {
    return ParseNormalFloat(is, negate_value, value);
  }

  if (next_char == '-') {
    negate_value = true;
    is.get();
    next_char = is.peek();
  }

  if (next_char == '0') {
    is.get();  // We may have to unget this.
    auto maybe_hex_start = is.peek();
    if (maybe_hex_start != 'x' && maybe_hex_start != 'X') {
      is.unget();
      return ParseNormalFloat(is, negate_value, value);
    } else {
      is.get();  // Throw away the 'x';
    }
  } else {
    return ParseNormalFloat(is, negate_value, value);
  }

  // This "looks" like a hex-float so treat it as one.
  bool seen_p = false;
  bool seen_dot = false;

  // The mantissa bits, without the most significant 1 bit, and with the
  // the most recently read bits in the least significant positions.
  uint_type fraction = 0;
  // The number of mantissa bits that have been read, including the leading 1
  // bit that is not written into 'fraction'.
  uint_type fraction_index = 0;

  // TODO(dneto): handle overflow and underflow
  int_type exponent = HF::exponent_bias;

  // Strip off leading zeros so we don't have to special-case them later.
  while ((next_char = is.peek()) == '0') {
    is.get();
  }

  // Does the mantissa, as written, have non-zero digits to the left of
  // the decimal point.  Assume no until proven otherwise.
  bool has_integer_part = false;
  bool bits_written = false;  // Stays false until we write a bit.

  // Scan the mantissa hex digits until we see a '.' or the 'p' that
  // starts the exponent.
  while (!seen_p && !seen_dot) {
    // Handle characters that are left of the fractional part.
    if (next_char == '.') {
      seen_dot = true;
    } else if (next_char == 'p') {
      seen_p = true;
    } else if (::isxdigit(next_char)) {
      // We have stripped all leading zeroes and we have not yet seen a ".".
      has_integer_part = true;
      int number = get_nibble_from_character(next_char);
      for (int i = 0; i < 4; ++i, number <<= 1) {
        uint_type write_bit = (number & 0x8) ? 0x1 : 0x0;
        if (bits_written) {
          // If we are here the bits represented belong in the fractional
          // part of the float, and we have to adjust the exponent accordingly.
          fraction = detail::set_nth_most_significant_bit(fraction, write_bit,
                                                          fraction_index);
          // Increment the fraction index. If the input has bizarrely many
          // significant digits, then silently drop them.
          detail::saturated_inc(fraction_index);
          if (!detail::saturated_inc(exponent)) {
            // Overflow failure
            is.setstate(std::ios::failbit);
            return is;
          }
        }
        // Since this updated after setting fraction bits, this effectively
        // drops the leading 1 bit.
        bits_written |= write_bit != 0;
      }
    } else {
      // We have not found our exponent yet, so we have to fail.
      is.setstate(std::ios::failbit);
      return is;
    }
    is.get();
    next_char = is.peek();
  }

  // Finished reading the part preceding any '.' or 'p'.

  bits_written = false;
  while (seen_dot && !seen_p) {
    // Handle only fractional parts now.
    if (next_char == 'p') {
      seen_p = true;
    } else if (::isxdigit(next_char)) {
      int number = get_nibble_from_character(next_char);
      for (int i = 0; i < 4; ++i, number <<= 1) {
        uint_type write_bit = (number & 0x8) ? 0x01 : 0x00;
        bits_written |= write_bit != 0;
        if ((!has_integer_part) && !bits_written) {
          // Handle modifying the exponent here this way we can handle
          // an arbitrary number of hex values without overflowing our
          // integer.
          if (!detail::saturated_dec(exponent)) {
            // Overflow failure
            is.setstate(std::ios::failbit);
            return is;
          }
        } else {
          fraction = detail::set_nth_most_significant_bit(fraction, write_bit,
                                                          fraction_index);
          // Increment the fraction index. If the input has bizarrely many
          // significant digits, then silently drop them.
          detail::saturated_inc(fraction_index);
        }
      }
    } else {
      // We still have not found our 'p' exponent yet, so this is not a valid
      // hex-float.
      is.setstate(std::ios::failbit);
      return is;
    }
    is.get();
    next_char = is.peek();
  }

  // Finished reading the part preceding 'p'.
  // In hex floats syntax, the binary exponent is required.

  bool seen_exponent_sign = false;
  int8_t exponent_sign = 1;
  bool seen_written_exponent_digits = false;
  // The magnitude of the exponent, as written, or the sentinel value to signal
  // overflow.
  int_type written_exponent = 0;
  // A sentinel value signalling overflow of the magnitude of the written
  // exponent.  We'll assume that -written_exponent_overflow is valid for the
  // type. Later we may add 1 or subtract 1 from the adjusted exponent, so leave
  // room for an extra 1.
  const int_type written_exponent_overflow =
      std::numeric_limits<int_type>::max() - 1;
  while (true) {
    if (!seen_written_exponent_digits &&
        (next_char == '-' || next_char == '+')) {
      if (seen_exponent_sign) {
        is.setstate(std::ios::failbit);
        return is;
      }
      seen_exponent_sign = true;
      exponent_sign = (next_char == '-') ? -1 : 1;
    } else if (::isdigit(next_char)) {
      seen_written_exponent_digits = true;
      // Hex-floats express their exponent as decimal.
      int_type digit =
          static_cast<int_type>(static_cast<int_type>(next_char) - '0');
      if (written_exponent >= (written_exponent_overflow - digit) / 10) {
        // The exponent is very big. Saturate rather than overflow the exponent.
        // signed integer, which would be undefined behaviour.
        written_exponent = written_exponent_overflow;
      } else {
        written_exponent = static_cast<int_type>(
            static_cast<int_type>(written_exponent * 10) + digit);
      }
    } else {
      break;
    }
    is.get();
    next_char = is.peek();
  }
  if (!seen_written_exponent_digits) {
    // Binary exponent had no digits.
    is.setstate(std::ios::failbit);
    return is;
  }

  written_exponent = static_cast<int_type>(written_exponent * exponent_sign);
  // Now fold in the exponent bias into the written exponent, updating exponent.
  // But avoid undefined behaviour that would result from overflowing int_type.
  if (written_exponent >= 0 && exponent >= 0) {
    // Saturate up to written_exponent_overflow.
    if (written_exponent_overflow - exponent > written_exponent) {
      exponent = static_cast<int_type>(written_exponent + exponent);
    } else {
      exponent = written_exponent_overflow;
    }
  } else if (written_exponent < 0 && exponent < 0) {
    // Saturate down to -written_exponent_overflow.
    if (written_exponent_overflow + exponent > -written_exponent) {
      exponent = static_cast<int_type>(written_exponent + exponent);
    } else {
      exponent = static_cast<int_type>(-written_exponent_overflow);
    }
  } else {
    // They're of opposing sign, so it's safe to add.
    exponent = static_cast<int_type>(written_exponent + exponent);
  }

  bool is_zero = (!has_integer_part) && (fraction == 0);
  if ((!has_integer_part) && !is_zero) {
    fraction = static_cast<uint_type>(fraction << 1);
    exponent = static_cast<int_type>(exponent - 1);
  } else if (is_zero) {
    exponent = 0;
  }

  if (exponent <= 0 && !is_zero) {
    fraction = static_cast<uint_type>(fraction >> 1);
    fraction |= static_cast<uint_type>(1) << HF::top_bit_left_shift;
  }

  fraction = (fraction >> HF::fraction_right_shift) & HF::fraction_encode_mask;

  const int_type max_exponent =
      SetBits<uint_type, 0, HF::num_exponent_bits>::get;

  // Handle denorm numbers
  while (exponent < 0 && !is_zero) {
    fraction = static_cast<uint_type>(fraction >> 1);
    exponent = static_cast<int_type>(exponent + 1);

    fraction &= HF::fraction_encode_mask;
    if (fraction == 0) {
      // We have underflowed our fraction. We should clamp to zero.
      is_zero = true;
      exponent = 0;
    }
  }

  // We have overflowed so we should be inf/-inf.
  if (exponent > max_exponent) {
    exponent = max_exponent;
    fraction = 0;
  }

  uint_type output_bits = static_cast<uint_type>(
      static_cast<uint_type>(negate_value ? 1 : 0) << HF::top_bit_left_shift);
  output_bits |= fraction;

  uint_type shifted_exponent = static_cast<uint_type>(
      static_cast<uint_type>(exponent << HF::exponent_left_shift) &
      HF::exponent_mask);
  output_bits |= shifted_exponent;

  T output_float(output_bits);
  value.set_value(output_float);

  return is;
}